

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_calendar_records_db(feed_db_t *db,calendar_record_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  char local_128 [8];
  char qr [119];
  sqlite3_stmt *local_a8;
  sqlite3_stmt *stmt;
  int local_98;
  int i;
  int record_count;
  feed_db_status_t res;
  calendar_record_t record;
  calendar_record_t **records_local;
  feed_db_t *db_local;
  
  record._104_8_ = records;
  local_98 = count_rows_db(db,"calendar");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_98;
  if (0 < local_98) {
    memcpy(local_128,
           "SELECT service_id,monday, tuesday, wednesday, thursday, friday, saturday, sunday,start_date, end_date FROM `calendar`;"
           ,0x77);
    sqlite3_prepare_v2(db->conn,local_128,-1,&local_a8,(char **)0x0);
    pvVar2 = malloc((long)local_98 * 0x70);
    *(void **)record._104_8_ = pvVar2;
    if (*(long *)record._104_8_ == 0) {
      sqlite3_finalize(local_a8);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_a8);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_calendar_record((calendar_record_t *)&record_count);
        puVar3 = sqlite3_column_text(local_a8,0);
        strcpy((char *)&record_count,(char *)puVar3);
        record.service_id._56_4_ = sqlite3_column_int(local_a8,1);
        record.service_id._60_4_ = sqlite3_column_int(local_a8,2);
        record.monday = sqlite3_column_int(local_a8,3);
        record.tuesday = sqlite3_column_int(local_a8,4);
        record.wednesday = sqlite3_column_int(local_a8,5);
        record.thursday = sqlite3_column_int(local_a8,6);
        record.friday = sqlite3_column_int(local_a8,7);
        puVar3 = sqlite3_column_text(local_a8,8);
        strcpy((char *)&record.saturday,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_a8,9);
        strcpy(record.start_date + 1,(char *)puVar3);
        memcpy((void *)(*(long *)record._104_8_ + (long)stmt._4_4_ * 0x70),&record_count,0x70);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_98);
      sqlite3_finalize(local_a8);
      db_local._4_4_ = local_98;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_calendar_records_db(feed_db_t *db, calendar_record_t **records) {

    calendar_record_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "calendar");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "service_id,"
                    "monday, tuesday, wednesday, thursday, friday, saturday, sunday,"
                    "start_date, end_date "
                "FROM `calendar`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_calendar_record(&record);

        strcpy(record.service_id, sqlite3_column_text(stmt, 0));
        record.monday = sqlite3_column_int(stmt, 1);
        record.tuesday = sqlite3_column_int(stmt, 2);
        record.wednesday = sqlite3_column_int(stmt, 3);
        record.thursday = sqlite3_column_int(stmt, 4);
        record.friday = sqlite3_column_int(stmt, 5);
        record.saturday = sqlite3_column_int(stmt, 6);
        record.sunday = sqlite3_column_int(stmt, 7);
        strcpy(record.start_date, sqlite3_column_text(stmt, 8));
        strcpy(record.end_date, sqlite3_column_text(stmt, 9));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}